

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_ResetHealth
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  player_t *ppVar1;
  int iVar2;
  undefined4 extraout_var;
  AActor *pAVar4;
  PClass *pPVar5;
  APlayerPawn *pAVar6;
  char *pcVar7;
  bool bVar8;
  PClass *pPVar3;
  undefined4 extraout_var_00;
  
  pPVar5 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
    goto LAB_003e2e30;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e2e20:
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e2e30:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1921,
                  "int AF_AActor_A_ResetHealth(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  pAVar4 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar4 == (AActor *)0x0) goto LAB_003e2d76;
    pPVar3 = (pAVar4->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(pAVar4->super_DThinker).super_DObject._vptr_DObject)(pAVar4);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (pAVar4->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar8 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar5 && bVar8) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar8 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar5) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar8) {
      pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e2e30;
    }
  }
  else {
    if (pAVar4 != (AActor *)0x0) goto LAB_003e2e20;
LAB_003e2d76:
    pAVar4 = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type == '\0') {
LAB_003e2d9d:
      pAVar4 = COPY_AAPTR(pAVar4,param[1].field_0.i);
      if (pAVar4 != (AActor *)0x0) {
        ppVar1 = pAVar4->player;
        if ((ppVar1 == (player_t *)0x0) || (pAVar6 = ppVar1->mo, (pAVar6->super_AActor).health < 1))
        {
          if (0 < pAVar4->health) {
            iVar2 = AActor::SpawnHealth(pAVar4);
            pAVar4->health = iVar2;
          }
        }
        else {
          pPVar5 = (pAVar6->super_AActor).super_DThinker.super_DObject.Class;
          if (pPVar5 == (PClass *)0x0) {
            iVar2 = (**(pAVar6->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar6);
            pPVar5 = (PClass *)CONCAT44(extraout_var_00,iVar2);
            (pAVar6->super_AActor).super_DThinker.super_DObject.Class = pPVar5;
            pAVar6 = ppVar1->mo;
          }
          iVar2 = *(int *)(pPVar5->Defaults + 0x1fc);
          (pAVar6->super_AActor).health = iVar2;
          ppVar1->health = iVar2;
        }
      }
      return 0;
    }
    pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
  }
  else {
    if (param[1].field_0.field_3.Type == '\0') goto LAB_003e2d9d;
    pcVar7 = "(param[paramnum]).Type == REGT_INT";
  }
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1922,
                "int AF_AActor_A_ResetHealth(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ResetHealth)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF(ptr);

	AActor *mobj = COPY_AAPTR(self, ptr);

	if (!mobj)
	{
		return 0;
	}

	player_t *player = mobj->player;
	if (player && (player->mo->health > 0))
	{
		player->health = player->mo->health = player->mo->GetDefault()->health; //Copied from the resurrect cheat.
	}
	else if (mobj && (mobj->health > 0))
	{
		mobj->health = mobj->SpawnHealth();
	}
	return 0;
}